

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

ProcessorInstance * __thiscall
soul::ResolutionPass::ProcessorInstanceResolver::visit
          (ProcessorInstanceResolver *this,ProcessorInstance *instance)

{
  Allocator *__args;
  string_view firstReplacement;
  Namespace *__args_1;
  bool bVar1;
  Expression *pEVar2;
  ProcessorBase *pPVar3;
  Graph *g;
  UnqualifiedName *pUVar4;
  string *psVar5;
  ModuleBase *pMVar6;
  ProcessorRef *o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view firstToReplace;
  size_t in_stack_fffffffffffffa38;
  char *in_stack_fffffffffffffa40;
  Context *this_00;
  CompileMessage local_490;
  UTF8Reader local_458;
  Ptr local_450;
  pool_ptr<soul::AST::ProcessorInstance> local_448;
  anon_class_88_2_5590cdb4 local_440;
  undefined1 local_3e8 [8];
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  oldCloneFn;
  pool_ptr<soul::AST::ProcessorBase> local_3a8;
  pool_ref<soul::AST::ProcessorBase> local_3a0;
  Namespace *local_398;
  Namespace *ns;
  basic_string_view<char,_std::char_traits<char>_> local_370;
  basic_string_view<char,_std::char_traits<char>_> local_360;
  IdentifierPath local_350;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  undefined1 local_218 [8];
  string nameRoot;
  undefined1 local_1f0 [7];
  bool requiresSpecialisation;
  CompileMessage local_1d0;
  IdentifierPath local_198;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_140;
  Scope local_128;
  pool_ptr<soul::AST::Graph> local_120;
  Graph *local_118;
  Graph *graph;
  CompileMessage local_b8;
  pool_ref<soul::AST::ProcessorBase> local_80;
  pool_ref<soul::AST::ProcessorBase> target;
  undefined1 local_70 [8];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  pool_ptr<soul::AST::ProcessorBase> local_28;
  pool_ptr<soul::AST::ProcessorBase> p;
  ProcessorInstance *instance_local;
  ProcessorInstanceResolver *this_local;
  
  p.object = (ProcessorBase *)instance;
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,instance);
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                     ((pool_ptr<soul::AST::Expression> *)
                      &((p.object)->super_ModuleBase).processorKeywordLocation);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_28);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_28);
    bVar1 = pool_ptr<soul::AST::ProcessorInstance>::operator==
                      (&pPVar3->owningInstance,(ProcessorInstance *)p.object);
    if (bVar1) {
      this_local = (ProcessorInstanceResolver *)p.object;
      specialisationArgs.space[3]._0_4_ = 1;
    }
    else {
      target.object =
           (ProcessorBase *)((p.object)->super_ModuleBase).processorKeywordLocation.location.data;
      AST::CommaSeparatedList::getAsExpressionList
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_70,
                 (pool_ptr<soul::AST::Expression> *)&target);
      pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&target);
      pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_28);
      pool_ref<soul::AST::ProcessorBase>::pool_ref<soul::AST::ProcessorBase,void>(&local_80,pPVar3);
      pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
      bVar1 = ModuleInstanceResolver::validateSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,(ArgList *)local_70,
                         &(pPVar3->super_ModuleBase).specialisationParams,
                         (bool)((this->super_ModuleInstanceResolver).
                                super_ErrorIgnoringRewritingASTVisitor.ignoreErrors & 1));
      if (bVar1) {
        AST::ASTObject::getParentScope((ASTObject *)p.object);
        AST::Scope::findProcessor(&local_128);
        cast<soul::AST::Graph,soul::AST::ProcessorBase>
                  ((soul *)&local_120,(pool_ptr<soul::AST::ProcessorBase> *)&local_128);
        g = pool_ptr<soul::AST::Graph>::operator*(&local_120);
        pool_ptr<soul::AST::Graph>::~pool_ptr(&local_120);
        pool_ptr<soul::AST::ProcessorBase>::~pool_ptr
                  ((pool_ptr<soul::AST::ProcessorBase> *)&local_128);
        local_118 = g;
        SanityCheckPass::RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
        bVar1 = AST::ProcessorInstance::isImplicitlyCreated((ProcessorInstance *)p.object);
        if (!bVar1) {
          pPVar3 = &local_118->super_ProcessorBase;
          pUVar4 = pool_ptr<soul::AST::UnqualifiedName>::operator->
                             ((pool_ptr<soul::AST::UnqualifiedName> *)
                              &((p.object)->super_ModuleBase).super_Scope);
          AST::UnqualifiedName::getIdentifierPath(&local_198,pUVar4);
          AST::Scope::getMatchingSubModules
                    (&local_140,&(pPVar3->super_ModuleBase).super_Scope,&local_198);
          bVar1 = std::
                  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                  ::empty(&local_140);
          std::
          vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
          ::~vector(&local_140);
          IdentifierPath::~IdentifierPath(&local_198);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pMVar6 = &(p.object)->super_ModuleBase;
            AST::ProcessorInstance::getReadableName_abi_cxx11_
                      ((string *)local_1f0,(ProcessorInstance *)p.object);
            Errors::alreadyProcessorWithName<std::__cxx11::string>
                      (&local_1d0,(Errors *)local_1f0,args);
            AST::Context::throwError(&(pMVar6->super_ASTObject).context,&local_1d0,false);
          }
        }
        pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
        bVar1 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,(ArgList *)local_70,
                           &(pPVar3->super_ModuleBase).specialisationParams);
        if (bVar1) {
          pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
          bVar1 = std::
                  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
                  ::empty(&(pPVar3->super_ModuleBase).specialisationParams);
          nameRoot.field_2._M_local_buf[0xf] = !bVar1;
          pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
          bVar1 = pool_ptr<soul::AST::ProcessorInstance>::operator!=
                            (&pPVar3->owningInstance,(void *)0x0);
          if ((bVar1) || ((nameRoot.field_2._M_local_buf[0xf] & 1U) != 0)) {
            pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
            psVar5 = Identifier::toString_abi_cxx11_(&(pPVar3->super_ModuleBase).name);
            std::__cxx11::string::string((string *)local_218,(string *)psVar5);
            if ((nameRoot.field_2._M_local_buf[0xf] & 1U) != 0) {
              (*(local_118->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject
                [0xd])(&local_350);
              IdentifierPath::toString_abi_cxx11_(&local_2f8,&local_350);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_360,":");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_370,"_");
              firstReplacement._M_str = in_stack_fffffffffffffa40;
              firstReplacement._M_len = in_stack_fffffffffffffa38;
              firstToReplace._M_str = (char *)local_370._M_len;
              firstToReplace._M_len = (size_t)local_360._M_str;
              choc::text::replace<std::__cxx11::string>
                        (&local_2d8,(text *)&local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_360._M_len,firstToReplace,firstReplacement);
              std::operator+(&local_2b8,&local_2d8,"_");
              pUVar4 = pool_ptr<soul::AST::UnqualifiedName>::operator->
                                 ((pool_ptr<soul::AST::UnqualifiedName> *)
                                  &((p.object)->super_ModuleBase).super_Scope);
              AST::UnqualifiedName::toString_abi_cxx11_((string *)&ns,pUVar4);
              std::operator+(&local_298,&local_2b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ns);
              makeSafeIdentifierName(&local_278,&local_298);
              std::operator+(&local_258,"_for_",&local_278);
              TokenisedPathString::join(&local_238,(string *)local_218,&local_258);
              std::__cxx11::string::operator=((string *)local_218,(string *)&local_238);
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_298);
              std::__cxx11::string::~string((string *)&ns);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2d8);
              std::__cxx11::string::~string((string *)&local_2f8);
              IdentifierPath::~IdentifierPath(&local_350);
            }
            pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
            local_398 = AST::ModuleBase::getNamespace(&pPVar3->super_ModuleBase);
            pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
            __args_1 = local_398;
            __args = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            AST::Scope::makeUniqueName
                      ((string *)&oldCloneFn._M_invoker,&(local_398->super_ModuleBase).super_Scope,
                       (string *)local_218);
            pMVar6 = std::
                     function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::operator()(&(pPVar3->super_ModuleBase).createClone,__args,__args_1,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&oldCloneFn._M_invoker);
            cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_3a8,pMVar6);
            pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_3a8);
            pool_ref<soul::AST::ProcessorBase>::pool_ref<soul::AST::ProcessorBase,void>
                      (&local_3a0,pPVar3);
            local_80.object = local_3a0.object;
            pool_ref<soul::AST::ProcessorBase>::~pool_ref(&local_3a0);
            pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_3a8);
            std::__cxx11::string::~string((string *)&oldCloneFn._M_invoker);
            if ((nameRoot.field_2._M_local_buf[0xf] & 1U) != 0) {
              pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
              std::
              function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_3e8,&(pPVar3->super_ModuleBase).createClone);
              std::
              function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_440.oldCloneFn,
                         (function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_3e8);
              ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::
              ArrayWithPreallocation
                        (&local_440.specialisationArgs,
                         (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)
                         local_70);
              pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
              std::
              function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
              ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
                           *)&(pPVar3->super_ModuleBase).createClone,&local_440);
              visit(soul::AST::ProcessorInstance&)::
              {lambda(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)#1}::
              ~basic_string((_lambda_soul__AST__Allocator__soul__AST__Namespace__std____cxx11__string_const___1_
                             *)&local_440);
              pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
              ModuleInstanceResolver::resolveAllSpecialisationArgs
                        ((ArgList *)local_70,&(pPVar3->super_ModuleBase).specialisationParams);
              std::
              function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_3e8);
            }
            std::__cxx11::string::~string((string *)local_218);
          }
          pool_ptr<soul::AST::ProcessorInstance>::pool_ptr<soul::AST::ProcessorInstance,void>
                    (&local_448,(ProcessorInstance *)p.object);
          pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
          (pPVar3->owningInstance).object = local_448.object;
          pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr(&local_448);
          pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
          (pPVar3->originalBeforeSpecialisation).object = local_28.object;
          o = AST::Allocator::
              allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorBase>&>
                        ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor
                         .allocator,&((p.object)->super_ModuleBase).super_ASTObject.context,
                         &local_80);
          pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::ProcessorRef,void>
                    ((pool_ptr<soul::AST::Expression> *)&local_450,o);
          ((p.object)->super_ModuleBase).processorKeywordLocation.sourceCode.object =
               local_450.object;
          pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&local_450);
          pool_ptr<soul::AST::Expression>::pool_ptr
                    ((pool_ptr<soul::AST::Expression> *)&local_458,(void *)0x0);
          ((p.object)->super_ModuleBase).processorKeywordLocation.location.data = local_458.data;
          pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&local_458);
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
          super_RewritingASTVisitor.itemsReplaced =
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
               super_RewritingASTVisitor.itemsReplaced + 1;
          this_local = (ProcessorInstanceResolver *)p.object;
        }
        else {
          (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
               + 1;
          this_local = (ProcessorInstanceResolver *)p.object;
        }
      }
      else {
        if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
             ignoreErrors & 1U) == 0) {
          pMVar6 = &(p.object)->super_ModuleBase;
          pPVar3 = pool_ref<soul::AST::ProcessorBase>::operator->(&local_80);
          (*(pPVar3->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&graph);
          Errors::wrongNumArgsForNamespace<soul::IdentifierPath>(&local_b8,(IdentifierPath *)&graph)
          ;
          AST::Context::throwError(&(pMVar6->super_ASTObject).context,&local_b8,false);
        }
        (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
             (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails +
             1;
        this_local = (ProcessorInstanceResolver *)p.object;
      }
      specialisationArgs.space[3]._0_4_ = 1;
      p.object = (ProcessorBase *)this_local;
      pool_ref<soul::AST::ProcessorBase>::~pool_ref(&local_80);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::~ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)local_70);
    }
  }
  else {
    specialisationArgs.space[3]._0_4_ = 0;
  }
  pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_28);
  if ((int)specialisationArgs.space[3] == 0) {
    if (((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors &
        1U) == 0) {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)
                          &((p.object)->super_ModuleBase).processorKeywordLocation);
      this_00 = &(pEVar2->super_Statement).super_ASTObject.context;
      Errors::expectedProcessorName<>();
      AST::Context::throwError(this_00,&local_490,false);
    }
    (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails =
         (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails + 1;
    this_local = (ProcessorInstanceResolver *)p.object;
  }
  return (ProcessorInstance *)this_local;
}

Assistant:

AST::ProcessorInstance& visit (AST::ProcessorInstance& instance) override
        {
            super::visit (instance);

            if (auto p = instance.targetProcessor->getAsProcessor())
            {
                if (p->owningInstance == instance)
                    return instance;

                auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (instance.specialisationArgs);
                auto target = pool_ref<AST::ProcessorBase> (*p);

                if (! validateSpecialisationArgs (specialisationArgs, target->specialisationParams, ignoreErrors))
                {
                    if (ignoreErrors)
                    {
                        ++numFails;
                        return instance;
                    }

                    instance.context.throwError (Errors::wrongNumArgsForNamespace (target->getFullyQualifiedDisplayPath()));
                }

                auto& graph = *cast<AST::Graph> (instance.getParentScope()->findProcessor());
                SanityCheckPass::RecursiveGraphDetector::check (graph);

                if (! instance.isImplicitlyCreated())
                    if (! graph.getMatchingSubModules (instance.instanceName->getIdentifierPath()).empty())
                        instance.context.throwError (Errors::alreadyProcessorWithName (instance.getReadableName()));

                if (! canResolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams))
                {
                    ++numFails;
                    return instance;
                }

                bool requiresSpecialisation = ! target->specialisationParams.empty();

                if (target->owningInstance != nullptr || requiresSpecialisation)
                {
                    auto nameRoot = target->name.toString();

                    if (requiresSpecialisation)
                        nameRoot = TokenisedPathString::join (nameRoot,
                                                              "_for_" + makeSafeIdentifierName (choc::text::replace (graph.getFullyQualifiedPath().toString(), ":", "_")
                                                                  + "_" + instance.instanceName->toString()));
                    auto& ns = target->getNamespace();
                    target = *cast<AST::ProcessorBase> (target->createClone (allocator, ns, ns.makeUniqueName (nameRoot)));

                    if (requiresSpecialisation)
                    {
                        auto oldCloneFn = target->createClone;

                        target->createClone = [=] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
                        {
                            auto& m = oldCloneFn (a, parentNS, newName);
                            resolveAllSpecialisationArgs (specialisationArgs, m.specialisationParams);
                            return m;
                        };

                        resolveAllSpecialisationArgs (specialisationArgs, target->specialisationParams);
                    }
                }

                target->owningInstance = instance;
                target->originalBeforeSpecialisation = p;
                instance.targetProcessor = allocator.allocate<AST::ProcessorRef> (instance.context, target);
                instance.specialisationArgs = nullptr;
                ++itemsReplaced;
                return instance;
            }

            if (! ignoreErrors)
                instance.targetProcessor->context.throwError (Errors::expectedProcessorName());

            ++numFails;
            return instance;
        }